

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O2

void __thiscall
cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::rules_holder
          (rules_holder<cppcms::xss::icompare_c_string,_false> *this)

{
  _Rb_tree_header *p_Var1;
  allocator local_31;
  string local_30;
  
  p_Var1 = &(this->super_basic_rules_holder).entities._M_t._M_impl.super__Rb_tree_header;
  (this->super_basic_rules_holder).entities._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_basic_rules_holder).entities._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_basic_rules_holder).entities._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_basic_rules_holder).entities._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_basic_rules_holder).entities._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_basic_rules_holder)._vptr_basic_rules_holder = (_func_int **)&PTR_add_tag_002b7ec8;
  p_Var1 = &(this->tags)._M_t._M_impl.super__Rb_tree_header;
  (this->tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->tags)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&local_30,"lt",&local_31);
  basic_rules_holder::add_entity(&this->super_basic_rules_holder,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"gt",&local_31);
  basic_rules_holder::add_entity(&this->super_basic_rules_holder,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"amp",&local_31);
  basic_rules_holder::add_entity(&this->super_basic_rules_holder,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"quot",&local_31);
  basic_rules_holder::add_entity(&this->super_basic_rules_holder,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

rules_holder()
		{
			add_entity("lt");
			add_entity("gt");
			add_entity("amp");
			add_entity("quot");
		}